

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

Test * CLParserTestDuplicatedHeader::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  CLParserTestDuplicatedHeader((CLParserTestDuplicatedHeader *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(CLParserTest, DuplicatedHeader) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "Note: including file: foo.h\r\n"
      "Note: including file: bar.h\r\n"
      "Note: including file: foo.h\r\n",
      "", &output, &err));
  // We should have dropped one copy of foo.h.
  ASSERT_EQ("", output);
  ASSERT_EQ(2u, parser.includes_.size());
}